

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::CheckCMP0037(cmMakefile *this,string *targetName,TargetType targetType)

{
  bool bVar1;
  PolicyStatus PVar2;
  ostream *poVar3;
  PolicyID id;
  bool bVar4;
  MessageType t;
  ostringstream e;
  string local_1c0;
  undefined1 local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  t = AUTHOR_WARNING;
  PVar2 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0037,false);
  if (PVar2 - NEW < 3) {
    t = FATAL_ERROR;
    bVar1 = true;
    bVar4 = true;
  }
  else {
    bVar1 = false;
    bVar4 = false;
    if (PVar2 == WARN) {
      bVar1 = false;
      t = AUTHOR_WARNING;
      if (targetType != INTERFACE_LIBRARY) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c0,(cmPolicies *)0x25,id);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a0,local_1c0._M_dataplus._M_p,
                            local_1c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        bVar4 = true;
        bVar1 = false;
        t = AUTHOR_WARNING;
      }
    }
  }
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"The target name \"",0x11);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,(targetName->_M_dataplus)._M_p,
                        targetName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,
               "\" is reserved or not valid for certain CMake features, such as generator expressions, and may result in undefined behavior."
               ,0x7b);
    std::__cxx11::stringbuf::str();
    IssueMessage(this,t,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if (bVar1) {
      bVar4 = false;
      goto LAB_001c1211;
    }
  }
  bVar4 = true;
LAB_001c1211:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return bVar4;
}

Assistant:

bool cmMakefile::CheckCMP0037(std::string const& targetName,
                              cmStateEnums::TargetType targetType) const
{
  MessageType messageType = MessageType::AUTHOR_WARNING;
  std::ostringstream e;
  bool issueMessage = false;
  switch (this->GetPolicyStatus(cmPolicies::CMP0037)) {
    case cmPolicies::WARN:
      if (targetType != cmStateEnums::INTERFACE_LIBRARY) {
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0037) << "\n";
        issueMessage = true;
      }
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      break;
    case cmPolicies::NEW:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      issueMessage = true;
      messageType = MessageType::FATAL_ERROR;
      break;
  }
  if (issueMessage) {
    e << "The target name \"" << targetName
      << "\" is reserved or not valid for certain "
         "CMake features, such as generator expressions, and may result "
         "in undefined behavior.";
    this->IssueMessage(messageType, e.str());

    if (messageType == MessageType::FATAL_ERROR) {
      return false;
    }
  }
  return true;
}